

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::extendWithLogicalBasis(HModel *this,int firstcol,int lastcol,int firstrow,int lastrow)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  
  iVar19 = lastcol - firstcol;
  if (iVar19 < 0) {
    iVar19 = -1;
  }
  uVar21 = lastrow - firstrow;
  if ((int)uVar21 < 0) {
    uVar21 = 0xffffffff;
  }
  if ((uVar21 ^ iVar19 + 1U) != 0xffffffff) {
    uVar20 = (ulong)(lastcol + 1U);
    if ((int)(lastcol + 1U) <= firstcol) {
      uVar20 = (ulong)(uint)firstcol;
    }
    uVar15 = lastrow + 1;
    uVar16 = firstrow;
    if (firstrow < (int)uVar15) {
      uVar16 = uVar15;
    }
    puts("extendWithLogicalBasis");
    std::ostream::flush();
    printf("numCol/Row/Tot = %d/%d/%d\n",(ulong)(uint)this->numCol,(ulong)(uint)this->numRow,
           (ulong)(uint)this->numTot);
    std::ostream::flush();
    printf("local_newNumCol/Row/Tot = %d/%d/%d\n",uVar20,(ulong)uVar16,(ulong)(uVar16 + (int)uVar20)
          );
    std::ostream::flush();
    bVar14 = nonbasicFlagBasicIndex_OK(this,firstcol,firstrow);
    if (!bVar14) {
      printf("HModel::extendWithLogicalBasis: basisOK = %d\n",0);
    }
    if (firstrow < this->numRow) {
      std::vector<int,_std::allocator<int>_>::resize(&this->basicIndex,(long)this->numRow);
      std::vector<double,_std::allocator<double>_>::resize(&this->baseLower,(long)this->numRow);
      std::vector<double,_std::allocator<double>_>::resize(&this->baseUpper,(long)this->numRow);
      std::vector<double,_std::allocator<double>_>::resize(&this->baseValue,(long)this->numRow);
    }
    if (firstcol + firstrow < this->numTot) {
      std::vector<int,_std::allocator<int>_>::resize(&this->nonbasicFlag,(long)this->numTot);
      std::vector<int,_std::allocator<int>_>::resize(&this->nonbasicMove,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workCost,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workDual,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workShift,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workLower,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workUpper,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workRange,(long)this->numTot);
      std::vector<double,_std::allocator<double>_>::resize(&this->workValue,(long)this->numTot);
    }
    iVar22 = this->numCol - firstcol;
    if (0 < firstrow && (iVar22 != 0 && firstcol <= this->numCol)) {
      piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = (ulong)(uint)firstrow + 1;
      do {
        piVar17 = piVar1 + lVar18 + -2;
        *piVar17 = *piVar17 + iVar22;
        piVar2[(long)this->numCol + lVar18 + -2] = piVar2[(long)firstcol + lVar18 + -2];
        piVar3[(long)this->numCol + lVar18 + -2] = piVar3[(long)firstcol + lVar18 + -2];
        lVar23 = this->numCol + lVar18;
        pdVar4[lVar23 + -2] = pdVar4[(long)firstcol + lVar18 + -2];
        pdVar5[lVar23 + -2] = pdVar5[(long)firstcol + lVar18 + -2];
        pdVar6[lVar23 + -2] = pdVar6[(long)firstcol + lVar18 + -2];
        pdVar7[lVar23 + -2] = pdVar7[(long)firstcol + lVar18 + -2];
        pdVar8[lVar23 + -2] = pdVar8[(long)firstcol + lVar18 + -2];
        pdVar9[lVar23 + -2] = pdVar9[(long)firstcol + lVar18 + -2];
        pdVar10[lVar23 + -2] = pdVar10[(long)firstcol + lVar18 + -2];
        lVar18 = lVar18 + -1;
      } while (1 < lVar18);
    }
    auVar13 = _DAT_001570e0;
    auVar12 = _DAT_001570a0;
    auVar11 = _DAT_00157090;
    uVar16 = lastcol - firstcol;
    if (firstcol <= lastcol) {
      piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar24._4_4_ = 0;
      auVar24._0_4_ = uVar16;
      auVar24._8_4_ = uVar16;
      auVar24._12_4_ = 0;
      uVar20 = 0;
      auVar24 = auVar24 ^ _DAT_001570a0;
      do {
        auVar25._8_4_ = (int)uVar20;
        auVar25._0_8_ = uVar20;
        auVar25._12_4_ = (int)(uVar20 >> 0x20);
        auVar26 = (auVar25 | auVar11) ^ auVar12;
        iVar22 = auVar24._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar22 && auVar24._0_4_ < auVar26._0_4_ ||
                    iVar22 < auVar26._4_4_) & 1)) {
          piVar1[(long)firstcol + uVar20] = 1;
        }
        if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
            auVar26._12_4_ <= auVar24._12_4_) {
          piVar1[(long)firstcol + uVar20 + 1] = 1;
        }
        auVar25 = (auVar25 | auVar13) ^ auVar12;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar25._0_4_ <= auVar24._0_4_)) {
          piVar1[(long)firstcol + uVar20 + 2] = 1;
          piVar1[(long)firstcol + uVar20 + 3] = 1;
        }
        uVar20 = uVar20 + 4;
      } while (((ulong)uVar16 + 4 & 0xfffffffffffffffc) != uVar20);
    }
    if (firstrow <= lastrow) {
      piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar17 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + firstrow;
      uVar16 = firstrow;
      do {
        iVar22 = this->numCol + uVar16;
        piVar1[iVar22] = 0;
        *piVar17 = iVar22;
        piVar17 = piVar17 + 1;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    if (firstcol <= lastcol) {
      iVar22 = this->objSense;
      pdVar4 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        pdVar5[firstcol + lVar18] = pdVar6[firstcol + lVar18] * (double)iVar22;
        pdVar4[firstcol + lVar18] = 0.0;
        lVar18 = lVar18 + 1;
      } while ((lastcol - firstcol) + 1 != (int)lVar18);
    }
    if (firstrow <= lastrow) {
      lVar18 = (long)this->numCol + (long)firstrow;
      pdVar4 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      do {
        pdVar5[lVar18 + lVar23] = 0.0;
        pdVar4[lVar18 + lVar23] = 0.0;
        lVar23 = lVar23 + 1;
      } while ((lastrow - firstrow) + 1 != (int)lVar23);
    }
    initPh2ColBound(this,firstcol,lastcol);
    initPh2RowBound(this,firstrow,lastrow);
    initValueFromNonbasic(this,firstcol,lastcol);
    this->numBasicLogicals = this->numBasicLogicals + uVar21 + 1;
    if (iVar19 + 1U != 0) {
      mlFg_Update(this,this->mlFg_action_NewCols);
    }
    if (uVar21 + 1 != 0) {
      mlFg_Update(this,this->mlFg_action_NewRows);
      return;
    }
  }
  return;
}

Assistant:

void HModel::extendWithLogicalBasis(int firstcol, int lastcol, int firstrow, int lastrow) {
  // Add nonbasic structurals and basic slacks according to model bounds.
  //
  // NB Assumes that the basis data structures and work vectors on
  // entry are assigned for columns 0..firstcol-1 and rows
  // 0..firstrow-1 and that they constitute a valid basis. Thus they
  // correspond to "firstcol" number of columns and "firstrow" number
  // of rows. Also assumes that numCol and numRow have already been
  // updated to correspond to any additional columns and rows. This is
  // necessary so that generic methods can be used to assign model
  // data to arrays dimensioned 0..numTot
  //
  // Null intervals firstcol...lastcol and firstrow...lastrow are
  // permitted, but this is achieved by setting the "last" to be less
  // than "first" since the latter is used to indicate what's
  // currently in the data structure.

  assert(firstcol >= 0);
  assert(firstrow >= 0);

  //printf("Called extendWithLogicalBasis:\n   numCol =   %d\n   firstcol = %d\n   lastcol =  %d\n   numRow =   %d\n   firstrow = %d\n   lastrow =  %d\n", numCol, firstcol, lastcol, numRow, firstrow, lastrow);
  // Determine the numbers of columns and rows to be added

  int numAddCol = max(lastcol-firstcol+1, 0);
  int numAddRow = max(lastrow-firstrow+1, 0);
  int numAddTot = numAddCol + numAddRow;
  if (numAddTot == 0) return;

  // Determine the numbers of columns and rows before and after this method

  int local_oldNumCol = firstcol;
  int local_oldNumRow = firstrow;
  int local_oldNumTot = local_oldNumCol + local_oldNumRow;

  int local_newNumCol = max(local_oldNumCol, lastcol+1);
  int local_newNumRow = max(local_oldNumRow, lastrow+1);
  int local_newNumTot = local_newNumCol + local_newNumRow;

  printf("extendWithLogicalBasis\n");cout<<flush;
  printf("numCol/Row/Tot = %d/%d/%d\n", numCol, numRow, numTot);cout<<flush;
  printf("local_newNumCol/Row/Tot = %d/%d/%d\n", local_newNumCol, local_newNumRow, local_newNumTot);cout<<flush;
  assert(local_newNumCol == numCol);
  assert(local_newNumRow == numRow);
  assert(local_newNumTot == numTot);
  //ToDo: Replace references to local_newNum* by references to num* from here on

#ifdef JAJH_dev
  // Check that columns 0..firstcol-1 and rows 0..firstrow-1 constitute a valid basis.
  bool basisOK = nonbasicFlagBasicIndex_OK(local_oldNumCol, local_oldNumRow);
  if (!basisOK) printf("HModel::extendWithLogicalBasis: basisOK = %d\n", basisOK);
  assert(basisOK);
#endif
    
  //  Resize if necessary

  if (numRow > local_oldNumRow) {
    basicIndex.resize(numRow);

    baseLower.resize(numRow);
    baseUpper.resize(numRow);
    baseValue.resize(numRow);
  }
  if (numTot > local_oldNumTot) {
    nonbasicFlag.resize(numTot);
    nonbasicMove.resize(numTot);

    workCost.resize(numTot);
    workDual.resize(numTot);
    workShift.resize(numTot);

    workLower.resize(numTot);
    workUpper.resize(numTot);
    workRange.resize(numTot);
    workValue.resize(numTot);
  }

  // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if necessary

  int rowShift = numCol - local_oldNumCol;
  if (rowShift > 0) {
    //printf("Shifting row data by %d using row=%d..0\n", rowShift, local_oldNumRow-1);cout << flush;
    for (int row = local_oldNumRow-1; row >=0; row--) {
      basicIndex[row] += rowShift;
      nonbasicFlag[numCol+row] = nonbasicFlag[local_oldNumCol+row];
      nonbasicMove[numCol+row] = nonbasicMove[local_oldNumCol+row];

      workCost[numCol+row] = workCost[local_oldNumCol+row];
      workDual[numCol+row] = workDual[local_oldNumCol+row];
      workShift[numCol+row] = workShift[local_oldNumCol+row];

      workLower[numCol+row] = workLower[local_oldNumCol+row];
      workUpper[numCol+row] = workUpper[local_oldNumCol+row];
      workRange[numCol+row] = workRange[local_oldNumCol+row];
      workValue[numCol+row] = workValue[local_oldNumCol+row];

      //printf("Setting basicIndex[%2d] = %2d; nonbasicFlag[%2d] = %2d; nonbasicMove[%2d] = %2d\n", 
      //      row, basicIndex[row],
      //      numCol+row, nonbasicFlag[local_oldNumCol+row],
      //      numCol+row, nonbasicMove[local_oldNumCol+row]);cout << flush;
    }
  }
  //rp_basis();
  //printf("After possibly shifting row data\n");
  //Make any new columns nonbasic
  //  printf("Make any new cols nonbasic: %d %d %d\n", numCol, firstcol, lastcol);
  for (int col = firstcol; col <= lastcol; col++) {
    int var = col;
    //    printf("Setting nonbasicFlag[%2d] = NONBASIC_FLAG_TRUE; Setting nonbasicMove[%2d] = %2d\n", var, var, get_nonbasicMoveCol(var));
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    //    printf("Calling get_nonbasicMoveCol(%2d)\n", var);
    //    nonbasicMove[var] = get_nonbasicMoveCol(var);
  }
  //Make any new rows basic
  //  printf("Make any new rows basic: %d %d %d\n", numRow, firstrow, lastrow);
  for (int row = firstrow; row <= lastrow; row++) {
    int var = numCol + row;
    //    printf("Setting nonbasicFlag[%2d] = NONBASIC_FLAG_FALSE; Setting basicIndex[%2d] = %2d\n", var, row, var);
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
    basicIndex[row] = var;
  }

  // Initialise costs for the new columns and rows
  initPh2ColCost(firstcol, lastcol);
  initPh2RowCost(firstrow, lastrow);
  
  // Initialise bounds for the new columns and rows
  initPh2ColBound(firstcol, lastcol);
  initPh2RowBound(firstrow, lastrow);
  
  // Initialise values (and nonbasicMove) for the new columns
  initValueFromNonbasic(firstcol, lastcol);

#ifdef JAJH_dev
  // Check that columns 0..firstcol-1 and rows 0..firstrow-1 constitute a valid basis.
  basisOK = nonbasicFlagBasicIndex_OK(numCol, numRow);
  assert(basisOK);
#endif

  numBasicLogicals += numAddRow;

  //  rp_basis();
  
  //Deduce the consequences of adding new columns and/or rows
  if (numAddCol) mlFg_Update(mlFg_action_NewCols);
  if (numAddRow) mlFg_Update(mlFg_action_NewRows);

}